

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::openStream(Runner *this)

{
  Config *pCVar1;
  ulong uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *psVar5;
  domain_error *this_00;
  streambuf *buf;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream oss;
  Runner *this_local;
  
  pCVar1 = Ptr<Catch::Config>::operator->(&this->m_config);
  Config::getFilename_abi_cxx11_(pCVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pCVar1 = Ptr<Catch::Config>::operator->(&this->m_config);
    Config::getFilename_abi_cxx11_(pCVar1);
    uVar3 = std::__cxx11::string::c_str();
    std::ofstream::open(&this->m_ofs,uVar3,0x10);
    uVar2 = std::ios::fail();
    if ((uVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      poVar4 = std::operator<<((ostream *)local_188,"Unable to open file: \'");
      pCVar1 = Ptr<Catch::Config>::operator->(&this->m_config);
      psVar5 = Config::getFilename_abi_cxx11_(pCVar1);
      poVar4 = std::operator<<(poVar4,(string *)psVar5);
      std::operator<<(poVar4,"\'");
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::domain_error::domain_error(this_00,local_1b8);
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
    pCVar1 = Ptr<Catch::Config>::operator->(&this->m_config);
    buf = (streambuf *)std::ofstream::rdbuf();
    Config::setStreamBuf(pCVar1,buf);
  }
  return;
}

Assistant:

void openStream() {
            // Open output file, if specified
            if( !m_config->getFilename().empty() ) {
                m_ofs.open( m_config->getFilename().c_str() );
                if( m_ofs.fail() ) {
                    std::ostringstream oss;
                    oss << "Unable to open file: '" << m_config->getFilename() << "'";
                    throw std::domain_error( oss.str() );
                }
                m_config->setStreamBuf( m_ofs.rdbuf() );
            }
        }